

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O0

void * SimulatorThread(void *pParam)

{
  undefined8 __stream;
  __suseconds_t _Var1;
  int iVar2;
  char *pcVar3;
  double *pdVar4;
  size_type sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_df0;
  interval local_de8;
  double local_dd0;
  vector<double,_std::allocator<double>_> local_dc8;
  vector<double,_std::allocator<double>_> local_db0;
  vector<double,_std::allocator<double>_> local_d98;
  vector<double,_std::allocator<double>_> local_d80;
  vector<double,_std::allocator<double>_> local_d68;
  vector<double,_std::allocator<double>_> local_d40;
  vector<double,_std::allocator<double>_> local_d28;
  double local_d10;
  double local_d08;
  interval local_d00;
  double local_ce8;
  interval local_ce0;
  interval local_cc8;
  double local_cb0;
  double alt_gps_mes_5;
  double lon_gps_mes_5;
  double lat_gps_mes_5;
  double z_gps_mes_5;
  double y_gps_mes_5;
  double x_gps_mes_5;
  interval local_c78;
  double local_c60;
  interval local_c58;
  interval local_c40;
  double local_c28;
  interval local_c20;
  double local_c08;
  interval local_c00;
  interval local_be8;
  double local_bd0;
  interval local_bc8;
  double local_bb0;
  interval local_ba8;
  interval local_b90;
  double local_b78;
  double vrydot_1;
  double vrxdot_3;
  double psidot_4;
  double zdot_1;
  double ydot_5;
  double xdot_5;
  double local_b40;
  interval local_b38;
  double local_b20;
  interval local_b18;
  interval local_b00;
  double local_ae8;
  double alt_gps_mes_4;
  double lon_gps_mes_4;
  double lat_gps_mes_4;
  double z_gps_mes_4;
  double y_gps_mes_4;
  double x_gps_mes_4;
  interval local_ab0;
  double local_a98;
  interval local_a90;
  interval local_a78;
  double local_a60;
  double psidot_3;
  double ydot_4;
  double xdot_4;
  double local_a40;
  interval local_a38;
  double local_a20;
  interval local_a18;
  interval local_a00;
  double local_9e8;
  double alt_gps_mes_3;
  double lon_gps_mes_3;
  double lat_gps_mes_3;
  double z_gps_mes_3;
  double y_gps_mes_3;
  double x_gps_mes_3;
  interval local_9b0;
  double local_998;
  interval local_990;
  interval local_978;
  double local_960;
  double psidot_2;
  double ydot_3;
  double xdot_3;
  double local_940;
  interval local_938;
  double local_920;
  interval local_918;
  interval local_900;
  double local_8e8;
  double alt_gps_mes_2;
  double lon_gps_mes_2;
  double lat_gps_mes_2;
  double z_gps_mes_2;
  double y_gps_mes_2;
  double x_gps_mes_2;
  interval local_8b0;
  double local_898;
  interval local_890;
  interval local_878;
  double local_860;
  interval local_858;
  double local_840;
  interval local_838;
  interval local_820;
  double local_808;
  interval local_800;
  double local_7e8;
  interval local_7e0;
  interval local_7c8;
  double local_7b0;
  double vrxdot_2;
  double ydot_2;
  double xdot_2;
  double fv;
  double fg;
  double gamma;
  double deltasmaxsimu;
  double deltar;
  double beta;
  double alphaw;
  double deltasmaxreal;
  double deltasminreal;
  double leq;
  double rs;
  double rr;
  double h;
  double l;
  double Jz;
  double Jx;
  double m;
  double alphaomegax;
  double local_700;
  interval local_6f8;
  double local_6e0;
  interval local_6d8;
  interval local_6c0;
  double local_6a8;
  double alt_gps_mes_1;
  double lon_gps_mes_1;
  double lat_gps_mes_1;
  double z_gps_mes_1;
  double y_gps_mes_1;
  double x_gps_mes_1;
  interval local_670;
  double local_658;
  interval local_650;
  interval local_638;
  double local_620;
  interval local_618;
  double local_600;
  interval local_5f8;
  interval local_5e0;
  double local_5c8;
  interval local_5c0;
  double local_5a8;
  interval local_5a0;
  interval local_588;
  double local_570;
  double vrydot;
  double vrxdot_1;
  double psidot_1;
  double ydot_1;
  double xdot_1;
  double local_540;
  interval local_538;
  double local_520;
  double local_518;
  interval local_510;
  double local_4f8;
  double local_4f0;
  interval local_4e8;
  double local_4d0;
  double local_4c8;
  interval local_4c0;
  double local_4a8;
  double local_4a0;
  interval local_498;
  double local_480;
  double local_478;
  interval local_470;
  double local_458;
  double vrz_mes;
  double vry_mes;
  double vrx_mes;
  double local_438;
  interval local_430;
  double local_418;
  interval local_410;
  interval local_3f8;
  double local_3e0;
  double alt_gps_mes;
  double lon_gps_mes;
  double lat_gps_mes;
  double z_gps_mes;
  double y_gps_mes;
  double x_gps_mes;
  interval local_3a8;
  double local_390;
  interval local_388;
  interval local_370;
  double local_358;
  interval local_350;
  double local_338;
  interval local_330;
  interval local_318;
  double local_300;
  interval local_2f8;
  double local_2e0;
  interval local_2d8;
  interval local_2c0;
  double local_2a8;
  interval local_2a0;
  double local_288;
  interval local_280;
  interval local_268;
  double local_250;
  double local_248;
  double local_240;
  double vrxdot;
  double psidot;
  double zdot;
  double ydot;
  double xdot;
  char logsimufilename [256];
  FILE *logsimufile;
  double hdg;
  double alt;
  double lon;
  double lat;
  double stepangles;
  double t_last_stepangles;
  double d2;
  double d1;
  double phidot;
  double deltas;
  double alphafvry;
  double hw;
  double psic;
  double vc;
  double vtwind_sim;
  double psitwind_sim;
  timeval tv;
  double t_epoch;
  double t0;
  double t;
  double dt;
  CHRONO chrono;
  void *pParam_local;
  
  t = 0.0;
  t0 = 0.0;
  tv.tv_usec = 0;
  vtwind_sim = 0.0;
  vc = 0.0;
  psic = 0.0;
  hw = 0.0;
  alphafvry = 0.0;
  deltas = 0.1;
  phidot = 0.0;
  d1 = 0.0;
  d2 = 0.0;
  t_last_stepangles = 0.0;
  stepangles = 0.0;
  lat = ((double)simulatorperiod / 1000.0) * omegas;
  lon = 0.0;
  alt = 0.0;
  hdg = 0.0;
  logsimufilename[0xf8] = '\0';
  logsimufilename[0xf9] = '\0';
  logsimufilename[0xfa] = '\0';
  logsimufilename[0xfb] = '\0';
  logsimufilename[0xfc] = '\0';
  logsimufilename[0xfd] = '\0';
  logsimufilename[0xfe] = '\0';
  logsimufilename[0xff] = '\0';
  chrono._64_8_ = pParam;
  if (bDisablelogsimu == 0) {
    EnterCriticalSection(&strtimeCS);
    pcVar3 = strtimeex_fns();
    sprintf((char *)&xdot,"log/logsimu_%.64s.csv",pcVar3);
    LeaveCriticalSection(&strtimeCS);
    logsimufilename._248_8_ = fopen((char *)&xdot,"w");
    if ((FILE *)logsimufilename._248_8_ == (FILE *)0x0) {
      printf("Unable to create log file.\n");
      if (bExit != 0) {
        return (void *)0x0;
      }
      bExit = 1;
      return (void *)0x0;
    }
    fprintf((FILE *)logsimufilename._248_8_,
            "t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;EPU1;EPU2;\n"
           );
    fflush((FILE *)logsimufilename._248_8_);
  }
  GNSSqualitySimulator = 0;
  t0 = 0.0;
  x_sim = x_0;
  y_sim = y_0;
  z_sim = z_0;
  phi_sim = phi_0;
  theta_sim = theta_0;
  psi_sim = psi_0;
  vrx_sim = vrx_0;
  vry_sim = vry_0;
  vrz_sim = vrz_0;
  omegax_sim = omegax_0;
  omegay_sim = omegay_0;
  omegaz_sim = omegaz_0;
  alpha_mes_simulator = alpha_0;
  d_sim = d_0;
  StartChrono((CHRONO *)&dt);
  GetTimeElapsedChrono((CHRONO *)&dt,&t0);
  stepangles = t0;
  do {
    uSleep((long)(simulatorperiod * 1000));
    dVar10 = t0;
    GetTimeElapsedChrono((CHRONO *)&dt,&t0);
    t = t0 - dVar10;
    iVar2 = gettimeofday((timeval *)&psitwind_sim,(__timezone_ptr_t)0x0);
    if (iVar2 != 0) {
      psitwind_sim = 0.0;
      tv.tv_sec = 0;
    }
    tv.tv_usec = (__suseconds_t)((double)tv.tv_sec * 1e-06 + (double)(long)psitwind_sim);
    EnterCriticalSection(&StateVariablesCS);
    dVar9 = vtwind_var;
    dVar10 = vtwind_med;
    iVar2 = rand();
    dVar6 = psitwind_var;
    dVar8 = psitwind_med;
    vc = dVar9 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + dVar10;
    iVar2 = rand();
    dVar9 = vc_var;
    dVar10 = vc_med;
    vtwind_sim = dVar6 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + dVar8;
    iVar2 = rand();
    dVar6 = psic_var;
    dVar8 = psic_med;
    psic = dVar9 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + dVar10;
    iVar2 = rand();
    dVar10 = hw_var;
    hw = dVar6 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + dVar8;
    iVar2 = rand();
    dVar9 = vrx_sim;
    alphafvry = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0);
    if (robid == 1) {
      dVar6 = cos(psi_sim);
      dVar8 = psic;
      dVar7 = cos(hw);
      dVar10 = vrx_sim;
      ydot = dVar9 * dVar6 + dVar8 * dVar7;
      dVar8 = sin(psi_sim);
      dVar9 = psic;
      dVar6 = sin(hw);
      zdot = dVar10 * dVar8 + dVar9 * dVar6;
      psidot = u3 * alphaz + vzup;
      vrxdot = (u1 - u2) * alphaomegaz;
      local_240 = (u1 + u2) * alphavrx + -(vrx_sim * alphafvrx);
      x_sim = t * ydot + x_sim;
      y_sim = t * zdot + y_sim;
      local_248 = t * psidot + z_sim;
      local_250 = 0.0;
      pdVar4 = std::min<double>(&local_248,&local_250);
      dVar10 = phi_sim;
      z_sim = *pdVar4;
      psi_sim = t * vrxdot + psi_sim;
      vrx_sim = t * local_240 + vrx_sim;
      local_288 = sensor_err(phi_bias_err,phi_max_rand_err);
      local_288 = dVar10 + local_288;
      interval::interval(&local_280,&local_288);
      local_2a8 = -phi_ahrs_acc;
      interval::interval(&local_2a0,&local_2a8,&phi_ahrs_acc);
      operator+(&local_268,&local_280,&local_2a0);
      interval::operator=((interval *)&phi_ahrs,&local_268);
      dVar10 = theta_sim;
      local_2e0 = sensor_err(theta_bias_err,theta_max_rand_err);
      local_2e0 = dVar10 + local_2e0;
      interval::interval(&local_2d8,&local_2e0);
      local_300 = -theta_ahrs_acc;
      interval::interval(&local_2f8,&local_300,&theta_ahrs_acc);
      operator+(&local_2c0,&local_2d8,&local_2f8);
      interval::operator=((interval *)&theta_ahrs,&local_2c0);
      dVar10 = psi_sim;
      local_338 = sensor_err(psi_bias_err,psi_max_rand_err);
      local_338 = dVar10 + local_338;
      interval::interval(&local_330,&local_338);
      local_358 = -psi_ahrs_acc;
      interval::interval(&local_350,&local_358,&psi_ahrs_acc);
      operator+(&local_318,&local_330,&local_350);
      interval::operator=((interval *)&psi_ahrs,&local_318);
      dVar10 = z_max_rand_err;
      dVar9 = z_sim + z_bias_err;
      iVar2 = rand();
      local_390 = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + dVar9 + alphafvry;
      interval::interval(&local_388,&local_390);
      x_gps_mes = -z_pressure_acc;
      interval::interval(&local_3a8,&x_gps_mes,&z_pressure_acc);
      operator+(&local_370,&local_388,&local_3a8);
      interval::operator=((interval *)&z_pressure,&local_370);
      if ((bEnableSimulatedGNSS == 0) ||
         (((bNoSimGNSSInsideObstacles != 0 &&
           ((bNoSimGNSSInsideObstacles == 0 ||
            (dVar10 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar10)))) ||
          (dVar10 = x_sim, z_sim < GPS_submarine_depth_limit)))) {
        GNSSqualitySimulator = 0;
      }
      else {
        GNSSqualitySimulator = 1;
        dVar8 = sensor_err(x_bias_err,x_max_rand_err);
        dVar9 = y_sim;
        y_gps_mes = dVar10 + dVar8;
        dVar10 = sensor_err(y_bias_err,y_max_rand_err);
        z_gps_mes = dVar9 + dVar10;
        dVar10 = x_max_rand_err * 5.0;
        iVar2 = rand();
        lat_gps_mes = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + 0.0;
        lon_gps_mes = 0.0;
        alt_gps_mes = 0.0;
        local_3e0 = 0.0;
        EnvCoordSystem2GPS(lat_env,long_env,alt_env,angle_env,y_gps_mes,z_gps_mes,lat_gps_mes,
                           &lon_gps_mes,&alt_gps_mes,&local_3e0);
        ComputeGNSSPosition(lon_gps_mes,alt_gps_mes,local_3e0,GNSSqualitySimulator,0,0.0);
        dVar10 = sqr(ydot);
        dVar9 = sqr(zdot);
        sog = sqrt(dVar10 + dVar9);
        local_418 = atan2(zdot,ydot);
        interval::interval(&local_410,&local_418);
        local_438 = -3.141592653589793;
        vrx_mes = 3.141592653589793;
        interval::interval(&local_430,&local_438,&vrx_mes);
        operator+(&local_3f8,&local_410,&local_430);
        interval::operator=((interval *)&cog_gps,&local_3f8);
      }
      dVar10 = vrx_sim;
      if (bEnableSimulatedDVL == 0) {
        local_4f0 = -10000.0;
        local_4f8 = 10000.0;
        interval::interval(&local_4e8,&local_4f0,&local_4f8);
        interval::operator=((interval *)&vrx_dvl,&local_4e8);
        local_518 = -10000.0;
        local_520 = 10000.0;
        interval::interval(&local_510,&local_518,&local_520);
        interval::operator=((interval *)&vry_dvl,&local_510);
        local_540 = -10000.0;
        xdot_1 = 10000.0;
        interval::interval(&local_538,&local_540,&xdot_1);
        interval::operator=((interval *)&vrz_dvl,&local_538);
      }
      else {
        dVar8 = sensor_err(vrx_bias_err,vrx_max_rand_err);
        dVar9 = vry_sim;
        vry_mes = dVar10 + dVar8;
        dVar8 = sensor_err(vry_bias_err,vry_max_rand_err);
        dVar10 = vrz_sim;
        vrz_mes = dVar9 + dVar8;
        local_458 = sensor_err(vrz_bias_err,vrz_max_rand_err);
        local_458 = dVar10 + local_458;
        local_478 = vry_mes - dvl_acc;
        local_480 = vry_mes + dvl_acc;
        interval::interval(&local_470,&local_478,&local_480);
        interval::operator=((interval *)&vrx_dvl,&local_470);
        local_4a0 = vrz_mes - dvl_acc;
        local_4a8 = vrz_mes + dvl_acc;
        interval::interval(&local_498,&local_4a0,&local_4a8);
        interval::operator=((interval *)&vry_dvl,&local_498);
        local_4c8 = local_458 - dvl_acc;
        local_4d0 = local_458 + dvl_acc;
        interval::interval(&local_4c0,&local_4c8,&local_4d0);
        interval::operator=((interval *)&vrz_dvl,&local_4c0);
      }
    }
    else if (robid == 0x100) {
      dVar6 = cos(psi_sim);
      dVar7 = cos(alphaomegaz * uw);
      dVar8 = psic;
      dVar11 = cos(hw);
      dVar10 = vrx_sim;
      ydot_1 = dVar9 * dVar6 * dVar7 + dVar8 * dVar11;
      dVar6 = sin(psi_sim);
      dVar7 = cos(alphaomegaz * uw);
      dVar8 = psic;
      dVar11 = sin(hw);
      dVar9 = vrx_sim;
      psidot_1 = dVar10 * dVar6 * dVar7 + dVar8 * dVar11;
      dVar8 = sin(alphaomegaz * uw);
      dVar10 = phi_sim;
      vrxdot_1 = (dVar9 * dVar8) / alphaz;
      vrydot = u * alphavrx + -(vrx_sim * alphafvrx);
      local_570 = -vry_sim * deltas;
      x_sim = t * ydot_1 + x_sim;
      y_sim = t * psidot_1 + y_sim;
      psi_sim = t * vrxdot_1 + psi_sim;
      vrx_sim = t * vrydot + vrx_sim;
      vry_sim = t * local_570 + vry_sim;
      local_5a8 = sensor_err(phi_bias_err,phi_max_rand_err);
      local_5a8 = dVar10 + local_5a8;
      interval::interval(&local_5a0,&local_5a8);
      local_5c8 = -phi_ahrs_acc;
      interval::interval(&local_5c0,&local_5c8,&phi_ahrs_acc);
      operator+(&local_588,&local_5a0,&local_5c0);
      interval::operator=((interval *)&phi_ahrs,&local_588);
      dVar10 = theta_sim;
      local_600 = sensor_err(theta_bias_err,theta_max_rand_err);
      local_600 = dVar10 + local_600;
      interval::interval(&local_5f8,&local_600);
      local_620 = -theta_ahrs_acc;
      interval::interval(&local_618,&local_620,&theta_ahrs_acc);
      operator+(&local_5e0,&local_5f8,&local_618);
      interval::operator=((interval *)&theta_ahrs,&local_5e0);
      dVar10 = psi_sim;
      local_658 = sensor_err(psi_bias_err,psi_max_rand_err);
      local_658 = dVar10 + local_658;
      interval::interval(&local_650,&local_658);
      x_gps_mes_1 = -psi_ahrs_acc;
      interval::interval(&local_670,&x_gps_mes_1,&psi_ahrs_acc);
      operator+(&local_638,&local_650,&local_670);
      interval::operator=((interval *)&psi_ahrs,&local_638);
      if ((bEnableSimulatedGNSS == 0) ||
         ((bNoSimGNSSInsideObstacles != 0 &&
          ((bNoSimGNSSInsideObstacles == 0 ||
           (dVar10 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar10)))))) {
        GNSSqualitySimulator = 0;
      }
      else {
        dVar10 = x_sim;
        GNSSqualitySimulator = 1;
        dVar8 = sensor_err(x_bias_err,x_max_rand_err);
        dVar9 = y_sim;
        y_gps_mes_1 = dVar10 + dVar8;
        dVar10 = sensor_err(y_bias_err,y_max_rand_err);
        z_gps_mes_1 = dVar9 + dVar10;
        dVar10 = x_max_rand_err * 5.0;
        iVar2 = rand();
        lat_gps_mes_1 = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + 0.0;
        lon_gps_mes_1 = 0.0;
        alt_gps_mes_1 = 0.0;
        local_6a8 = 0.0;
        EnvCoordSystem2GPS(lat_env,long_env,alt_env,angle_env,y_gps_mes_1,z_gps_mes_1,lat_gps_mes_1,
                           &lon_gps_mes_1,&alt_gps_mes_1,&local_6a8);
        ComputeGNSSPosition(lon_gps_mes_1,alt_gps_mes_1,local_6a8,GNSSqualitySimulator,0,0.0);
        dVar10 = sqr(ydot_1);
        dVar9 = sqr(psidot_1);
        sog = sqrt(dVar10 + dVar9);
        local_6e0 = atan2(psidot_1,ydot_1);
        interval::interval(&local_6d8,&local_6e0);
        local_700 = -3.141592653589793;
        alphaomegax = 3.141592653589793;
        interval::interval(&local_6f8,&local_700,&alphaomegax);
        operator+(&local_6c0,&local_6d8,&local_6f8);
        interval::operator=((interval *)&cog_gps,&local_6c0);
      }
    }
    else if (robid == 0x1000) {
      m = 40.0;
      Jx = 280.0;
      Jz = 15.0;
      l = 50.0;
      h = 0.5;
      rr = 2.1;
      rs = 1.5;
      leq = 0.5;
      deltasminreal = 0.2;
      deltasmaxreal = 0.3;
      alphaw = 1.2;
      beta = 100.0;
      deltar = 0.01;
      deltasmaxsimu = alphaomegaz * uw;
      gamma = u * 0.8999999999999999 + 0.3;
      dVar10 = cos(psi_sim - vtwind_sim);
      dVar9 = cos(gamma);
      fg = dVar10 + dVar9;
      if (0.0 <= fg) {
        dVar10 = sin(psi_sim - vtwind_sim);
        if (dVar10 <= 0.0) {
          phidot = -gamma;
        }
        else {
          phidot = gamma;
        }
      }
      else {
        phidot = (3.141592653589793 - psi_sim) + vtwind_sim;
      }
      dVar10 = alphaz * vrx_sim;
      dVar9 = sin(deltasmaxsimu);
      fv = dVar10 * dVar9;
      dVar9 = alphavrx * vc;
      dVar8 = sin((psi_sim + phidot) - vtwind_sim);
      dVar10 = vrx_sim;
      xdot_2 = dVar9 * dVar8;
      dVar6 = cos(psi_sim);
      dVar7 = deltar * vc;
      dVar11 = cos(vtwind_sim);
      dVar8 = psic;
      dVar12 = cos(hw);
      dVar9 = vrx_sim;
      ydot_2 = dVar8 * dVar12 + dVar10 * dVar6 + dVar7 * dVar11;
      dVar8 = sin(psi_sim);
      dVar6 = deltar * vc;
      dVar7 = sin(vtwind_sim);
      dVar10 = psic;
      dVar11 = sin(hw);
      vrxdot_2 = dVar10 * dVar11 + dVar9 * dVar8 + dVar6 * dVar7;
      dVar8 = 1.0 / Jx;
      dVar7 = sin(phidot);
      dVar10 = xdot_2;
      dVar11 = sin(deltasmaxsimu);
      dVar6 = h;
      dVar9 = leq;
      local_7b0 = dVar8 * (-(alphafvrx * vrx_sim) * vrx_sim + dVar7 * dVar10 + -(dVar11 * fv));
      x_sim = t * ydot_2 + x_sim;
      y_sim = t * vrxdot_2 + y_sim;
      vrx_sim = t * local_7b0 + vrx_sim;
      psi_sim = omegaz_sim * t + psi_sim;
      dVar7 = 1.0 / l;
      dVar11 = cos(phidot);
      dVar8 = rs;
      dVar10 = xdot_2;
      dVar12 = cos(deltasmaxsimu);
      omegaz_sim = dVar7 * (beta * alphafvry +
                           -alphafomegaz * omegaz_sim +
                           (-dVar9 * dVar11 + dVar6) * dVar10 + -(dVar8 * dVar12 * fv)) * t +
                   omegaz_sim;
      dVar10 = (-m * d1) / Jz;
      dVar9 = xdot_2 * rr;
      dVar8 = cos(phidot);
      dVar6 = cos(phi_sim);
      dVar6 = (dVar9 * dVar8 * dVar6) / Jz;
      dVar9 = Jx * 9.81 * deltasminreal;
      dVar8 = sin(phi_sim);
      d1 = ((dVar10 + dVar6) - (dVar9 * dVar8) / Jz) * t + d1;
      dVar10 = d1 * t + phi_sim;
      phi_sim = dVar10;
      local_7e8 = sensor_err(phi_bias_err,phi_max_rand_err);
      local_7e8 = dVar10 + local_7e8;
      interval::interval(&local_7e0,&local_7e8);
      local_808 = -phi_ahrs_acc;
      interval::interval(&local_800,&local_808,&phi_ahrs_acc);
      operator+(&local_7c8,&local_7e0,&local_800);
      interval::operator=((interval *)&phi_ahrs,&local_7c8);
      dVar10 = theta_sim;
      local_840 = sensor_err(theta_bias_err,theta_max_rand_err);
      local_840 = dVar10 + local_840;
      interval::interval(&local_838,&local_840);
      local_860 = -theta_ahrs_acc;
      interval::interval(&local_858,&local_860,&theta_ahrs_acc);
      operator+(&local_820,&local_838,&local_858);
      interval::operator=((interval *)&theta_ahrs,&local_820);
      dVar10 = psi_sim;
      local_898 = sensor_err(psi_bias_err,psi_max_rand_err);
      local_898 = dVar10 + local_898;
      interval::interval(&local_890,&local_898);
      x_gps_mes_2 = -psi_ahrs_acc;
      interval::interval(&local_8b0,&x_gps_mes_2,&psi_ahrs_acc);
      operator+(&local_878,&local_890,&local_8b0);
      interval::operator=((interval *)&psi_ahrs,&local_878);
      if ((bEnableSimulatedGNSS == 0) ||
         ((bNoSimGNSSInsideObstacles != 0 &&
          ((bNoSimGNSSInsideObstacles == 0 ||
           (dVar10 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar10)))))) {
        GNSSqualitySimulator = 0;
      }
      else {
        dVar10 = x_sim;
        GNSSqualitySimulator = 1;
        dVar8 = sensor_err(x_bias_err,x_max_rand_err);
        dVar9 = y_sim;
        y_gps_mes_2 = dVar10 + dVar8;
        dVar10 = sensor_err(y_bias_err,y_max_rand_err);
        z_gps_mes_2 = dVar9 + dVar10;
        dVar10 = x_max_rand_err * 5.0;
        iVar2 = rand();
        lat_gps_mes_2 = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + 0.0;
        lon_gps_mes_2 = 0.0;
        alt_gps_mes_2 = 0.0;
        local_8e8 = 0.0;
        EnvCoordSystem2GPS(lat_env,long_env,alt_env,angle_env,y_gps_mes_2,z_gps_mes_2,lat_gps_mes_2,
                           &lon_gps_mes_2,&alt_gps_mes_2,&local_8e8);
        ComputeGNSSPosition(lon_gps_mes_2,alt_gps_mes_2,local_8e8,GNSSqualitySimulator,0,0.0);
        dVar10 = sqr(ydot_2);
        dVar9 = sqr(vrxdot_2);
        sog = sqrt(dVar10 + dVar9);
        local_920 = atan2(vrxdot_2,ydot_2);
        interval::interval(&local_918,&local_920);
        local_940 = -3.141592653589793;
        xdot_3 = 3.141592653589793;
        interval::interval(&local_938,&local_940,&xdot_3);
        operator+(&local_900,&local_918,&local_938);
        interval::operator=((interval *)&cog_gps,&local_900);
        sailangle = fmod_360_pos_rad2deg((-angle_env - (psi_sim + phidot)) + 1.5707963267948966);
        dVar9 = vtwind_sim;
        dVar8 = sensor_err(0.0,psitwind_var);
        dVar10 = vc;
        psitwind = dVar9 + dVar8;
        dVar9 = sensor_err(0.0,psitwind_var);
        vtwind = dVar10 + dVar9;
      }
    }
    else if (robid == 0x10000) {
      dVar9 = alphavrx * u;
      vrx_sim = dVar9;
      dVar8 = cos(psi_sim);
      dVar10 = vrx_sim;
      ydot_3 = dVar9 * dVar8;
      dVar9 = sin(psi_sim);
      psidot_2 = dVar10 * dVar9;
      local_960 = uw * alphaomegaz;
      x_sim = t * ydot_3 + x_sim;
      y_sim = t * psidot_2 + y_sim;
      dVar10 = t * local_960 + psi_sim;
      psi_sim = dVar10;
      local_998 = sensor_err(psi_bias_err,psi_max_rand_err);
      local_998 = dVar10 + local_998;
      interval::interval(&local_990,&local_998);
      x_gps_mes_3 = -psi_ahrs_acc;
      interval::interval(&local_9b0,&x_gps_mes_3,&psi_ahrs_acc);
      operator+(&local_978,&local_990,&local_9b0);
      interval::operator=((interval *)&psi_ahrs,&local_978);
      if ((bEnableSimulatedGNSS == 0) ||
         ((bNoSimGNSSInsideObstacles != 0 &&
          ((bNoSimGNSSInsideObstacles == 0 ||
           (dVar10 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar10)))))) {
        GNSSqualitySimulator = 0;
      }
      else {
        dVar10 = x_sim;
        GNSSqualitySimulator = 1;
        dVar8 = sensor_err(x_bias_err,x_max_rand_err);
        dVar9 = y_sim;
        y_gps_mes_3 = dVar10 + dVar8;
        dVar10 = sensor_err(y_bias_err,y_max_rand_err);
        z_gps_mes_3 = dVar9 + dVar10;
        dVar10 = x_max_rand_err * 5.0;
        iVar2 = rand();
        lat_gps_mes_3 = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + 0.0;
        lon_gps_mes_3 = 0.0;
        alt_gps_mes_3 = 0.0;
        local_9e8 = 0.0;
        EnvCoordSystem2GPS(lat_env,long_env,alt_env,angle_env,y_gps_mes_3,z_gps_mes_3,lat_gps_mes_3,
                           &lon_gps_mes_3,&alt_gps_mes_3,&local_9e8);
        ComputeGNSSPosition(lon_gps_mes_3,alt_gps_mes_3,local_9e8,GNSSqualitySimulator,0,0.0);
        dVar10 = sqr(ydot_3);
        dVar9 = sqr(psidot_2);
        sog = sqrt(dVar10 + dVar9);
        local_a20 = atan2(psidot_2,ydot_3);
        interval::interval(&local_a18,&local_a20);
        local_a40 = -3.141592653589793;
        xdot_4 = 3.141592653589793;
        interval::interval(&local_a38,&local_a40,&xdot_4);
        operator+(&local_a00,&local_a18,&local_a38);
        interval::operator=((interval *)&cog_gps,&local_a00);
      }
    }
    else if (robid == 0x100000) {
      dVar9 = alphavrx * u;
      vrx_sim = dVar9;
      dVar8 = cos(psi_sim);
      dVar6 = cos(alphaomegaz * uw);
      dVar10 = vrx_sim;
      ydot_4 = dVar9 * dVar8 * dVar6;
      dVar8 = sin(psi_sim);
      dVar6 = cos(alphaomegaz * uw);
      dVar9 = vrx_sim;
      psidot_3 = dVar10 * dVar8 * dVar6;
      dVar10 = sin(alphaomegaz * uw);
      local_a60 = (dVar9 * dVar10) / alphaz;
      x_sim = t * ydot_4 + x_sim;
      y_sim = t * psidot_3 + y_sim;
      dVar10 = t * local_a60 + psi_sim;
      psi_sim = dVar10;
      local_a98 = sensor_err(psi_bias_err,psi_max_rand_err);
      local_a98 = dVar10 + local_a98;
      interval::interval(&local_a90,&local_a98);
      x_gps_mes_4 = -psi_ahrs_acc;
      interval::interval(&local_ab0,&x_gps_mes_4,&psi_ahrs_acc);
      operator+(&local_a78,&local_a90,&local_ab0);
      interval::operator=((interval *)&psi_ahrs,&local_a78);
      if ((bEnableSimulatedGNSS == 0) ||
         ((bNoSimGNSSInsideObstacles != 0 &&
          ((bNoSimGNSSInsideObstacles == 0 ||
           (dVar10 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar10)))))) {
        GNSSqualitySimulator = 0;
      }
      else {
        dVar10 = x_sim;
        GNSSqualitySimulator = 1;
        dVar8 = sensor_err(x_bias_err,x_max_rand_err);
        dVar9 = y_sim;
        y_gps_mes_4 = dVar10 + dVar8;
        dVar10 = sensor_err(y_bias_err,y_max_rand_err);
        z_gps_mes_4 = dVar9 + dVar10;
        dVar10 = x_max_rand_err * 5.0;
        iVar2 = rand();
        lat_gps_mes_4 = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + 0.0;
        lon_gps_mes_4 = 0.0;
        alt_gps_mes_4 = 0.0;
        local_ae8 = 0.0;
        EnvCoordSystem2GPS(lat_env,long_env,alt_env,angle_env,y_gps_mes_4,z_gps_mes_4,lat_gps_mes_4,
                           &lon_gps_mes_4,&alt_gps_mes_4,&local_ae8);
        ComputeGNSSPosition(lon_gps_mes_4,alt_gps_mes_4,local_ae8,GNSSqualitySimulator,0,0.0);
        dVar10 = sqr(ydot_4);
        dVar9 = sqr(psidot_3);
        sog = sqrt(dVar10 + dVar9);
        local_b20 = atan2(psidot_3,ydot_4);
        interval::interval(&local_b18,&local_b20);
        local_b40 = -3.141592653589793;
        xdot_5 = 3.141592653589793;
        interval::interval(&local_b38,&local_b40,&xdot_5);
        operator+(&local_b00,&local_b18,&local_b38);
        interval::operator=((interval *)&cog_gps,&local_b00);
      }
    }
    else if (robid == 0x1000000) {
      ydot_5 = vrx_sim;
      zdot_1 = vry_sim;
      psidot_4 = u3 * alphaz;
      vrxdot_3 = alphaomegaz * uw;
      dVar10 = alphavrx * u;
      dVar9 = cos(psi_sim);
      dVar8 = alphavrx * ul;
      dVar6 = sin(psi_sim);
      vrydot_1 = -alphafvrx * vrx_sim + dVar10 * dVar9 + -(dVar8 * dVar6);
      dVar9 = alphavrx * u;
      dVar8 = sin(psi_sim);
      dVar6 = alphavrx * ul;
      dVar7 = cos(psi_sim);
      dVar10 = phi_sim;
      local_b78 = -deltas * vry_sim + dVar9 * dVar8 + dVar6 * dVar7;
      x_sim = t * ydot_5 + x_sim;
      y_sim = t * zdot_1 + y_sim;
      z_sim = t * psidot_4 + z_sim;
      psi_sim = t * vrxdot_3 + psi_sim;
      vrx_sim = t * vrydot_1 + vrx_sim;
      vry_sim = t * local_b78 + vry_sim;
      local_bb0 = sensor_err(phi_bias_err,phi_max_rand_err);
      local_bb0 = dVar10 + local_bb0;
      interval::interval(&local_ba8,&local_bb0);
      local_bd0 = -phi_ahrs_acc;
      interval::interval(&local_bc8,&local_bd0,&phi_ahrs_acc);
      operator+(&local_b90,&local_ba8,&local_bc8);
      interval::operator=((interval *)&phi_ahrs,&local_b90);
      dVar10 = theta_sim;
      local_c08 = sensor_err(theta_bias_err,theta_max_rand_err);
      local_c08 = dVar10 + local_c08;
      interval::interval(&local_c00,&local_c08);
      local_c28 = -theta_ahrs_acc;
      interval::interval(&local_c20,&local_c28,&theta_ahrs_acc);
      operator+(&local_be8,&local_c00,&local_c20);
      interval::operator=((interval *)&theta_ahrs,&local_be8);
      dVar10 = psi_sim;
      local_c60 = sensor_err(psi_bias_err,psi_max_rand_err);
      local_c60 = dVar10 + local_c60;
      interval::interval(&local_c58,&local_c60);
      x_gps_mes_5 = -psi_ahrs_acc;
      interval::interval(&local_c78,&x_gps_mes_5,&psi_ahrs_acc);
      operator+(&local_c40,&local_c58,&local_c78);
      interval::operator=((interval *)&psi_ahrs,&local_c40);
      if ((bEnableSimulatedGNSS == 0) ||
         ((bNoSimGNSSInsideObstacles != 0 &&
          ((bNoSimGNSSInsideObstacles == 0 ||
           (dVar10 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar10)))))) {
        GNSSqualitySimulator = 0;
      }
      else {
        dVar10 = x_sim;
        GNSSqualitySimulator = 1;
        dVar8 = sensor_err(x_bias_err,x_max_rand_err);
        dVar9 = y_sim;
        y_gps_mes_5 = dVar10 + dVar8;
        dVar10 = sensor_err(y_bias_err,y_max_rand_err);
        z_gps_mes_5 = dVar9 + dVar10;
        dVar10 = x_max_rand_err * 5.0;
        iVar2 = rand();
        lat_gps_mes_5 = dVar10 * (((double)iVar2 * 2.0) / 2147483647.0 - 1.0) + 0.0;
        lon_gps_mes_5 = 0.0;
        alt_gps_mes_5 = 0.0;
        local_cb0 = 0.0;
        EnvCoordSystem2GPS(lat_env,long_env,alt_env,angle_env,y_gps_mes_5,z_gps_mes_5,lat_gps_mes_5,
                           &lon_gps_mes_5,&alt_gps_mes_5,&local_cb0);
        ComputeGNSSPosition(lon_gps_mes_5,alt_gps_mes_5,local_cb0,GNSSqualitySimulator,0,0.0);
        dVar10 = sqr(ydot_5);
        dVar9 = sqr(zdot_1);
        sog = sqrt(dVar10 + dVar9);
        local_ce8 = atan2(zdot_1,ydot_5);
        interval::interval(&local_ce0,&local_ce8);
        local_d08 = -3.141592653589793;
        local_d10 = 3.141592653589793;
        interval::interval(&local_d00,&local_d08,&local_d10);
        operator+(&local_cc8,&local_ce0,&local_d00);
        interval::operator=((interval *)&cog_gps,&local_cc8);
      }
    }
    stepangles = lat / omegas + stepangles;
    alpha_mes_simulator = ((double)simulatorperiod / 1000.0) * omegas + alpha_mes_simulator;
    if (alpha_0 + 6.283185307179586 < alpha_mes_simulator) {
      alpha_mes_simulator = alpha_0;
    }
    dVar8 = alpha_mes_simulator;
    dVar6 = sensor_err(alpha_bias_err,alpha_max_rand_err);
    dVar9 = y_sim;
    dVar10 = x_sim;
    alpha_sim = dVar8 - dVar6;
    dVar8 = alpha_sim + alphas + psi_sim;
    std::vector<double,_std::allocator<double>_>::vector(&local_d28,&walls_xa);
    std::vector<double,_std::allocator<double>_>::vector(&local_d40,&walls_ya);
    std::vector<double,_std::allocator<double>_>::vector(&local_d68,&walls_xb);
    std::vector<double,_std::allocator<double>_>::vector(&local_d80,&walls_yb);
    d2 = DistanceDirSegments(dVar10,dVar9,dVar8,&local_d28,&local_d40,&local_d68,&local_d80);
    std::vector<double,_std::allocator<double>_>::~vector(&local_d80);
    std::vector<double,_std::allocator<double>_>::~vector(&local_d68);
    std::vector<double,_std::allocator<double>_>::~vector(&local_d40);
    std::vector<double,_std::allocator<double>_>::~vector(&local_d28);
    dVar9 = y_sim;
    dVar10 = x_sim;
    dVar8 = alpha_sim + alphas + psi_sim;
    std::vector<double,_std::allocator<double>_>::vector(&local_d98,&circles_x);
    std::vector<double,_std::allocator<double>_>::vector(&local_db0,&circles_y);
    std::vector<double,_std::allocator<double>_>::vector(&local_dc8,&circles_r);
    t_last_stepangles = DistanceDirCircles(dVar10,dVar9,dVar8,&local_d98,&local_db0,&local_dc8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_dc8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_db0);
    std::vector<double,_std::allocator<double>_>::~vector(&local_d98);
    pdVar4 = std::min<double>(&d2,&t_last_stepangles);
    d_sim = *pdVar4;
    iVar2 = rand();
    if ((double)iVar2 / 2147483647.0 < outliers_ratio) {
      dVar10 = (double)rangescale;
      iVar2 = rand();
      d_sim = (dVar10 * (double)iVar2) / 2147483647.0;
    }
    dVar10 = d_sim;
    dVar9 = sensor_err(d_bias_err,d_max_rand_err);
    d_mes_simulator = dVar10 + dVar9;
    local_dd0 = 0.0;
    pdVar4 = std::max<double>(&local_dd0,&d_mes_simulator);
    d_mes_simulator = *pdVar4;
    std::vector<interval,_std::allocator<interval>_>::clear(&d_all_mes_simulator);
    interval::interval(&local_de8,&d_mes_simulator);
    std::vector<interval,_std::allocator<interval>_>::push_back(&d_all_mes_simulator,&local_de8);
    std::deque<double,_std::allocator<double>_>::push_back
              (&alpha_mes_simulator_vector,&alpha_mes_simulator);
    std::deque<double,_std::allocator<double>_>::push_back(&d_mes_simulator_vector,&d_mes_simulator)
    ;
    std::
    deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ::push_back(&d_all_mes_simulator_vector,&d_all_mes_simulator);
    local_df0 = (double)tv.tv_sec * 1e-06 + (double)(long)psitwind_sim;
    std::deque<double,_std::allocator<double>_>::push_back(&t_simulator_history_vector,&local_df0);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&xhat_simulator_history_vector,(value_type *)&xhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&yhat_simulator_history_vector,(value_type *)&yhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&psihat_simulator_history_vector,(value_type *)&psihat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&vrxhat_simulator_history_vector,(value_type *)&vrxhat);
    sVar5 = std::deque<double,_std::allocator<double>_>::size(&alpha_mes_simulator_vector);
    if (6.283185307179586 / (((double)simulatorperiod / 1000.0) * omegas) < (double)(int)sVar5) {
      std::deque<double,_std::allocator<double>_>::pop_front(&alpha_mes_simulator_vector);
      std::deque<double,_std::allocator<double>_>::pop_front(&d_mes_simulator_vector);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::pop_front(&d_all_mes_simulator_vector);
      std::deque<double,_std::allocator<double>_>::pop_front(&t_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&xhat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&yhat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&psihat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&vrxhat_simulator_history_vector);
    }
    EnvCoordSystem2GPS(lat_env,long_env,alt_env,angle_env,x_sim,y_sim,z_sim,&lon,&alt,&hdg);
    dVar6 = fmod_2PI((-angle_env - psi_sim) + 4.71238898038469);
    _Var1 = tv.tv_usec;
    dVar8 = lon;
    dVar9 = alt;
    dVar10 = hdg;
    __stream = logsimufilename._248_8_;
    if (logsimufilename._248_8_ != 0) {
      fmod_360_rad2deg(alpha_sim);
      fprintf((FILE *)__stream,
              "%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;\n"
              ,_Var1,dVar8,dVar9,dVar10,((dVar6 + 3.141592653589793) * 180.0) / 3.141592653589793,0,
              0,0);
      fflush((FILE *)logsimufilename._248_8_);
    }
    LeaveCriticalSection(&StateVariablesCS);
  } while (bExit == 0);
  StopChrono((CHRONO *)&dt,&t0);
  GNSSqualitySimulator = 0;
  if (logsimufilename._248_8_ != 0) {
    fclose((FILE *)logsimufilename._248_8_);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SimulatorThread(void* pParam)
{
	CHRONO chrono;
	double dt = 0, t = 0, t0 = 0, t_epoch = 0;
	struct timeval tv;

	// Wind, current and waves.
	double psitwind_sim = 0, vtwind_sim = 0;
	double vc = 0, psic = 0, hw = 0;
	
	// Motorboat simulator...
	double alphafvry = 0.1;

	// Sailboat simulator...
	double deltas = 0, phidot = 0;

	// Simulated sonar...
	double d1 = 0, d2 = 0;
	double t_last_stepangles = 0;
	// Temporary...
	double stepangles = (simulatorperiod/1000.0)*omegas;// 0.6;

	double lat = 0, lon = 0, alt = 0, hdg = 0;

	FILE* logsimufile = NULL;
	char logsimufilename[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	if (!bDisablelogsimu)
	{
		EnterCriticalSection(&strtimeCS);
		sprintf(logsimufilename, LOG_FOLDER"logsimu_%.64s.csv", strtimeex_fns());
		LeaveCriticalSection(&strtimeCS);
		logsimufile = fopen(logsimufilename, "w");
		if (logsimufile == NULL)
		{
			printf("Unable to create log file.\n");
			if (!bExit) bExit = TRUE; // Unexpected program exit...
			return 0;
		}

		fprintf(logsimufile,
			"t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);"
			"t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;"
			"xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;"
			"wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;"
			"uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;"
			"EPU1;EPU2;\n"
		);
		fflush(logsimufile);
	}

	GNSSqualitySimulator = GNSS_NO_FIX;

	t = 0;

	x_sim = x_0; y_sim = y_0; z_sim = z_0; phi_sim = phi_0; theta_sim = theta_0; psi_sim = psi_0; vrx_sim = vrx_0; vry_sim = vry_0; vrz_sim = vrz_0; omegax_sim = omegax_0; omegay_sim = omegay_0; omegaz_sim = omegaz_0;
	alpha_mes_simulator = alpha_0; d_sim = d_0;

	StartChrono(&chrono);
	GetTimeElapsedChrono(&chrono, &t);

	t_last_stepangles = t;

	for (;;)
	{
		uSleep(1000*simulatorperiod);
		t0 = t;
		GetTimeElapsedChrono(&chrono, &t);
		dt = t-t0;

		//printf("SimulatorThread period : %f s.\n", dt);

		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		t_epoch = tv.tv_sec+0.000001*tv.tv_usec;
		//utc = 1000.0*tv.tv_sec+0.001*tv.tv_usec;

		EnterCriticalSection(&StateVariablesCS);

		// Simulated environnement evolution (wind, current and waves).
		vtwind_sim = vtwind_med+vtwind_var*(2.0*rand()/(double)RAND_MAX-1.0);
		psitwind_sim = psitwind_med+psitwind_var*(2.0*rand()/(double)RAND_MAX-1.0);
		vc = vc_med+vc_var*(2.0*rand()/(double)RAND_MAX-1.0);
		psic = psic_med+psic_var*(2.0*rand()/(double)RAND_MAX-1.0);
		hw = hw_var*(2.0*rand()/(double)RAND_MAX-1.0);

		if (robid == SUBMARINE_SIMULATOR_ROBID)
		{
			// z_sim should change when at the surface because of waves, but not underwater...
			// z_mes should change underwater because of waves, but not at the surface...

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)+vc*sin(psic);
			double zdot = u3*alphaz+vzup;
			double psidot = (u1-u2)*alphaomegaz;
			//double psidot = omegaz_sim;
			double vrxdot = (u1+u2)*alphavrx-vrx_sim*alphafvrx;
			//double omegazdot = (u1-u2)*alphaomegaz-omegaz_sim*alphafomegaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			z_sim = min(z_sim+dt*zdot, 0.0); // z always negative.
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			//omegaz_sim = omegaz_sim+dt*omegazdot;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// Pressure sensor.
			// Simplification : on suppose qu'il envoie directement z au lieu de pressure.
			// Les vagues perturbent ses mesures.
			z_pressure = z_sim+z_bias_err+z_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0)+hw+interval(-z_pressure_acc, z_pressure_acc); // Waves influence...
			// GPS available on surface.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0)))&&
				(z_sim >= GPS_submarine_depth_limit))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// DVL.
			if (bEnableSimulatedDVL)
			{
				double vrx_mes = vrx_sim+sensor_err(vrx_bias_err, vrx_max_rand_err);
				double vry_mes = vry_sim+sensor_err(vry_bias_err, vry_max_rand_err);
				double vrz_mes = vrz_sim+sensor_err(vrz_bias_err, vrz_max_rand_err);
				vrx_dvl = interval(vrx_mes-dvl_acc, vrx_mes+dvl_acc);
				vry_dvl = interval(vry_mes-dvl_acc, vry_mes+dvl_acc);
				vrz_dvl = interval(vrz_mes-dvl_acc, vrz_mes+dvl_acc);
			}
			else
			{
				vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
				vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
				vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
			}
		}
		else if (robid == MOTORBOAT_SIMULATOR_ROBID)
		{
			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)*cos(alphaomegaz*uw)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)*cos(alphaomegaz*uw)+vc*sin(psic);
			double psidot = vrx_sim*sin(alphaomegaz*uw)/alphaz;
			double vrxdot = u*alphavrx-vrx_sim*alphafvrx;
			double vrydot = -vry_sim*alphafvry;
			//double xdot = vx_sim;
			//double ydot = vy_sim;
			//double psidot = ;
			//double vrxdot = ;
			//double vrydot = ;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			vry_sim = vry_sim+dt*vrydot;
			//vx_sim = vx_sim+dt*vxdot;
			//vy_sim = vy_sim+dt*vydot;

			//delta = beta*u(2);
			//theta = x(3);
			//vx = x(4);
			//vy = x(5);
			//xdot = [vx;vy;
			//        (vx*cos(theta)+vy*sin(theta))*sin(delta)/(L/2);
			//        alpha*u(1)*cos(theta)-alphaf*vx;
			//        alpha*u(1)*sin(theta)-alphaf*vy];

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}
		else if (robid == SAILBOAT_SIMULATOR_ROBID)
		{
			// The model is described in "L. Jaulin Mod�lisation et commande d'un bateau � voile, CIFA2004, Douz (Tunisie)".

			double alphaomegax = 40.0;
			double m = 280.0;
			double Jx = 15.0;
			double Jz = 50.0;
			double l = 0.5;
			double h = 2.1;
			double rr = 1.5;
			double rs = 0.5;
			double leq = 0.2;
			double deltasminreal = 0.30;
			double deltasmaxreal = 1.20;
			double alphaw = 100.0;
			double beta = 0.01;

			double deltar = alphaomegaz*uw;
			double deltasmaxsimu = deltasminreal+u*(deltasmaxreal-deltasminreal);

			double gamma = cos(psi_sim-psitwind_sim)+cos(deltasmaxsimu);
			if (gamma<0) deltas = M_PI-psi_sim+psitwind_sim; // Voile en drapeau.
			else if (sin(psi_sim-psitwind_sim)>0) deltas = deltasmaxsimu; else deltas = -deltasmaxsimu;
			double fg = alphaz*vrx_sim*sin(deltar);
			double fv = alphavrx*vtwind_sim*sin(psi_sim+deltas-psitwind_sim);

			double xdot = vrx_sim*cos(psi_sim)+beta*vtwind_sim*cos(psitwind_sim)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)+beta*vtwind_sim*sin(psitwind_sim)+vc*sin(psic);
			double vrxdot = (1/m)*(sin(deltas)*fv-sin(deltar)*fg-alphafvrx*vrx_sim*vrx_sim);
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			vrx_sim = vrx_sim+dt*vrxdot;
			psi_sim += omegaz_sim*dt;
			omegaz_sim += (1/Jz)*((l-rs*cos(deltas))*fv-rr*cos(deltar)*fg-alphafomegaz*omegaz_sim+alphaw*hw)*dt;
			phidot += (-alphaomegax*phidot/Jx+fv*h*cos(deltas)*cos(phi_sim)/Jx-m*9.81*leq*sin(phi_sim)/Jx)*dt;
			phi_sim += phidot*dt;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
				sailangle = fmod_360_pos_rad2deg(-angle_env-(psi_sim+deltas)+M_PI/2.0); // Specific to VAIMOS...
				psitwind = psitwind_sim+sensor_err(0, psitwind_var);
				vtwind = vtwind_sim+sensor_err(0, psitwind_var);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}
		else if (robid == TANK_SIMULATOR_ROBID)
		{
			vrx_sim = alphavrx*u;

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim);
			double ydot = vrx_sim*sin(psi_sim);
			double psidot = uw*alphaomegaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;

			// Simulated sensors measurements.
			// Compass.
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// Odometers...
			//vrx_mes = vrx_sim+vrx_bias_err+vrx_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
		}
		else if (robid == BUGGY_SIMULATOR_ROBID)
		{
			vrx_sim = alphavrx*u;

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)*cos(alphaomegaz*uw);
			double ydot = vrx_sim*sin(psi_sim)*cos(alphaomegaz*uw);
			double psidot = vrx_sim*sin(alphaomegaz*uw)/alphaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;

			// Simulated sensors measurements.
			// Compass.
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// Odometers...
			//vrx_mes = vrx_sim+vrx_bias_err+vrx_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
		}
		else if (robid == QUADRO_SIMULATOR_ROBID)
		{

			//double m = 10, b = 2, delt = 1, l = 1;

			//box sqrtuquadro = box(4);
			//sqrtuquadro[1] = sqrt(u1); sqrtuquadro[2] = sqrt(u2); sqrtuquadro[3] = sqrt(u3); sqrtuquadro[4] = sqrt(u4);
			//box w = 5*sqrtuquadro;

			//imatrix R_Euler = RotationPhiThetaPsi(phi_sim, theta_sim, psi_sim);
			//box Vr = box(vrx_sim, vry_sim, vrz_sim);
			//box pdot = R_Euler*Vr;
			//box p = box(x_sim, y_sim, z_sim);
			//p = p+dt*pdot;
			//x_sim = Center(p[1]);
			//y_sim = Center(p[2]);
			//z_sim = Center(p[3]);

			//rmatrix M = Zeros(3, 3);
			//M.SetVal(1, 1, 1); M.SetVal(1, 2, tan(theta_sim)*sin(phi_sim)); M.SetVal(1, 3, tan(theta_sim)*cos(phi_sim));
			//M.SetVal(2, 1, 0); M.SetVal(2, 2, cos(phi_sim)); M.SetVal(2, 3, -sin(phi_sim));
			//M.SetVal(3, 1, 0); M.SetVal(3, 2, sin(phi_sim)/cos(theta_sim)); M.SetVal(3, 3, cos(phi_sim)/cos(theta_sim));

			//box Wr = box(omegax_sim, omegay_sim, omegaz_sim);
			//box anglesdot = imatrix(M)*Wr;
			//box angles = box(phi_sim, theta_sim, psi_sim);
			//angles = angles+dt*anglesdot;
			//phi_sim = Center(angles[1]);
			//theta_sim = Center(angles[2]);
			//psi_sim = Center(angles[3]);
			//
			//rmatrix B = Zeros(4, 4);
			//B.SetVal(1, 1, b); B.SetVal(1, 2, b); B.SetVal(1, 3, b); B.SetVal(1, 4, b);
			//B.SetVal(2, 1, -b*l); B.SetVal(2, 2, 0); B.SetVal(2, 3, b*l); B.SetVal(2, 4, 0);
			//B.SetVal(3, 1, 0); B.SetVal(3, 2, -b*l); B.SetVal(3, 3, 0); B.SetVal(3, 4, b*l);
			//B.SetVal(4, 1, -delt); B.SetVal(4, 2, delt); B.SetVal(4, 3, -delt); B.SetVal(4, 4, delt);

			//box wabsw = box(4);
			//wabsw[1] = w[1]*Abs(w[1]); wabsw[2] = w[2]*Abs(w[2]); wabsw[3] = w[3]*Abs(w[3]); wabsw[4] = w[4]*Abs(w[4]);

			//box tau = imatrix(B)*wabsw;

			//box Vrdot = Transpose(R_Euler)*box(0, 0, STANDARD_GRAVITY)+box(0, 0, -tau[1]/m)-box(Wr[2]*Vr[3]-Wr[3]*Vr[2], Wr[3]*Vr[1]-Wr[1]*Vr[3], Wr[1]*Vr[2]-Wr[2]*Vr[1]);
			//Vr = Vr+dt*Vrdot;
			//vrx_sim = Center(Vr[1]);
			//vry_sim = Center(Vr[2]);
			//vrz_sim = Center(Vr[3]);

			//rmatrix I = Zeros(3, 3);
			//I.SetVal(1, 1, 10); I.SetVal(1, 2, 0); I.SetVal(1, 3, 0);
			//I.SetVal(2, 1, 0); I.SetVal(2, 2, 10); I.SetVal(2, 3, 0);
			//I.SetVal(3, 1, 0); I.SetVal(3, 2, 0); I.SetVal(3, 3, 20);

			//box IWr = imatrix(I)*Wr;
			//box Wrdot = imatrix(Inv(I))*(box(tau[2], tau[3], tau[4])-box(Wr[2]*IWr[3]-Wr[3]*IWr[2], Wr[3]*IWr[1]-Wr[1]*IWr[3], Wr[1]*IWr[2]-Wr[2]*IWr[1]));
			//Wr = Wr+dt*Wrdot;
			//omegax_sim = Center(Wr[1]);
			//omegay_sim = Center(Wr[2]);
			//omegaz_sim = Center(Wr[3]);

			// Not fully implemented...

			// Simulated state evolution.
			double xdot = vrx_sim;
			double ydot = vry_sim;
			double zdot = u3*alphaz;
			double psidot = alphaomegaz*uw;
			double vrxdot = alphavrx*u*cos(psi_sim)-alphavrx*ul*sin(psi_sim)-alphafvrx*vrx_sim;
			double vrydot = alphavrx*u*sin(psi_sim)+alphavrx*ul*cos(psi_sim)-alphafvry*vry_sim;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			z_sim = z_sim+dt*zdot;
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			vry_sim = vry_sim+dt*vrydot;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}

		// Sonar.
		//for (;;)
		{
		//if (t-t_last_stepangles <= stepangles/omegas) break;

		// nsteps == 2*M_PI/stepangles
		// Previously, stepangles == (simulatorperiod/1000.0)*omegas
		
		t_last_stepangles += stepangles/omegas;
		//alpha_mes_simulator = alpha_mes_simulator+stepangles;
		alpha_mes_simulator = alpha_mes_simulator+(simulatorperiod/1000.0)*omegas;
		if (alpha_mes_simulator > 2*M_PI+alpha_0)
		{
			alpha_mes_simulator = alpha_0;
		}
		alpha_sim = alpha_mes_simulator-sensor_err(alpha_bias_err, alpha_max_rand_err);
		// Compute the distance to the first obstacle d. d might be oo if no obstacle found.
		d1 = DistanceDirSegments(x_sim, y_sim, alpha_sim+alphas+psi_sim, walls_xa, walls_ya, walls_xb, walls_yb);
		d2 = DistanceDirCircles(x_sim, y_sim, alpha_sim+alphas+psi_sim, circles_x, circles_y, circles_r);
		d_sim = min(d1, d2);

		// Generate outliers.
		if ((double)rand()/(double)RAND_MAX < outliers_ratio)
		{
			d_sim = rangescale*(double)rand()/(double)RAND_MAX;
		}

		d_mes_simulator = d_sim+sensor_err(d_bias_err, d_max_rand_err);
		d_mes_simulator = max(0.0, d_mes_simulator);
		//d_mes_simulator = max(0.0, min((double)rangescale, d_mes_simulator));

		// For compatibility with a Seanet...
		d_all_mes_simulator.clear();
		/*
		// Outlier before the wall.
		d_all_mes_simulator.push_back(d_mes_simulator*(double)rand()/(double)RAND_MAX);
		*/
		// Wall (or sometimes also an outlier...).
		d_all_mes_simulator.push_back(d_mes_simulator);
		/*
		// Outlier after the wall.
		d_all_mes_simulator.push_back(d_mes_simulator+(rangescale-d_mes_simulator)*(double)rand()/(double)RAND_MAX);
		*/

		alpha_mes_simulator_vector.push_back(alpha_mes_simulator);
		d_mes_simulator_vector.push_back(d_mes_simulator);
		d_all_mes_simulator_vector.push_back(d_all_mes_simulator);
		t_simulator_history_vector.push_back(tv.tv_sec+0.000001*tv.tv_usec);
		xhat_simulator_history_vector.push_back(xhat);
		yhat_simulator_history_vector.push_back(yhat);
		psihat_simulator_history_vector.push_back(psihat);
		vrxhat_simulator_history_vector.push_back(vrxhat);

		if ((int)alpha_mes_simulator_vector.size() > 2*M_PI/((simulatorperiod/1000.0)*omegas))
		{
			alpha_mes_simulator_vector.pop_front();
			d_mes_simulator_vector.pop_front();
			d_all_mes_simulator_vector.pop_front();
			t_simulator_history_vector.pop_front();
			xhat_simulator_history_vector.pop_front();
			yhat_simulator_history_vector.pop_front();
			psihat_simulator_history_vector.pop_front();
			vrxhat_simulator_history_vector.pop_front();
		}
		}

		EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_sim, y_sim, z_sim, &lat, &lon, &alt);
		hdg = (fmod_2PI(-angle_env-psi_sim+3.0*M_PI/2.0)+M_PI)*180.0/M_PI;

		if (logsimufile)
		{
			fprintf(logsimufile,
				"%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;\n",
				t_epoch, lat, lon, alt, hdg, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, d_sim, fmod_360_rad2deg(alpha_sim), 0.0, utc,
				t, x_sim, y_sim, z_sim, 0.0, 0.0, psi_sim,
				vrx_sim, 0.0, 0.0, 0.0, 0.0, omegaz_sim, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, u1, u2, u3, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0);
			fflush(logsimufile);
		}

		LeaveCriticalSection(&StateVariablesCS);

		if (bExit) break;
	}

	StopChrono(&chrono, &t);

	GNSSqualitySimulator = GNSS_NO_FIX;

	if (logsimufile)
	{
		fclose(logsimufile);
	}

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}